

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

deUint32 deqp::gls::ShaderExecUtil::getVecStd430ByteAlignment(DataType type)

{
  int iVar1;
  deUint32 dVar2;
  
  iVar1 = glu::getDataTypeScalarSize(type);
  dVar2 = 0;
  if (iVar1 - 1U < 4) {
    dVar2 = *(deUint32 *)(&DAT_0087c7f0 + (ulong)(iVar1 - 1U) * 4);
  }
  return dVar2;
}

Assistant:

static deUint32 getVecStd430ByteAlignment (glu::DataType type)
{
	switch (glu::getDataTypeScalarSize(type))
	{
		case 1:		return 4u;
		case 2:		return 8u;
		case 3:		return 16u;
		case 4:		return 16u;
		default:
			DE_ASSERT(false);
			return 0u;
	}
}